

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sigproc.cc
# Opt level: O3

void sptk::snack::xrwindow(float *din,float *dout,int n,float preemp)

{
  long lVar1;
  uint uVar2;
  
  if ((preemp != 0.0) || (NAN(preemp))) {
    if (0 < n) {
      uVar2 = n + 1;
      lVar1 = 0;
      do {
        *(float *)((long)dout + lVar1) =
             *(float *)((long)din + lVar1) * -preemp + *(float *)((long)din + lVar1 + 4);
        lVar1 = lVar1 + 4;
        uVar2 = uVar2 - 1;
      } while (1 < uVar2);
    }
  }
  else if (0 < n) {
    uVar2 = n + 1;
    lVar1 = 0;
    do {
      *(undefined4 *)((long)dout + lVar1) = *(undefined4 *)((long)din + lVar1);
      lVar1 = lVar1 + 4;
      uVar2 = uVar2 - 1;
    } while (1 < uVar2);
  }
  return;
}

Assistant:

void xrwindow(float *din, float *dout, int n, float preemp)
#endif
{
  register float *p;
 
/* If preemphasis is to be performed,  this assumes that there are n+1 valid
   samples in the input buffer (din). */
  if(preemp != 0.0) {
    for( p=din+1; n-- > 0; )
      *dout++ = (float)((*p++) - (preemp * *din++));
  } else {
    for( ; n-- > 0; )
      *dout++ =  *din++;
  }
}